

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

void __thiscall wasm::Literal::~Literal(Literal *this)

{
  Type *this_00;
  bool bVar1;
  HeapType local_28;
  HeapType local_20;
  
  if (6 < (this->type).id) {
    this_00 = &this->type;
    bVar1 = wasm::Type::isNull(this_00);
    if ((!bVar1) && (bVar1 = wasm::Type::isData(this_00), !bVar1)) {
      local_28 = wasm::Type::getHeapType(this_00);
      bVar1 = HeapType::isMaybeShared(&local_28,ext);
      if (!bVar1) {
        local_20 = wasm::Type::getHeapType(this_00);
        bVar1 = HeapType::isMaybeShared(&local_20,any);
        if ((!bVar1) && (bVar1 = wasm::Type::isExn(this_00), !bVar1)) {
          return;
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->field_0).func.super_IString.str._M_str);
  }
  return;
}

Assistant:

Literal::~Literal() {
  // Early exit for the common case; basic types need no special handling.
  if (type.isBasic()) {
    return;
  }
  if (isNull() || isData() || type.getHeapType().isMaybeShared(HeapType::ext) ||
      type.getHeapType().isMaybeShared(HeapType::any)) {
    gcData.~shared_ptr();
  } else if (isExn()) {
    exnData.~shared_ptr();
  }
}